

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O0

void ncnn::quantize_to_int8(Mat *src,Mat *dst,Mat *scale_data,Option *opt)

{
  Layer *pLVar1;
  undefined8 in_RCX;
  long in_RDX;
  size_t in_RSI;
  undefined8 in_RDI;
  Mat weights [1];
  ParamDict pd;
  Layer *quantize;
  Mat *in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffeec;
  Mat *in_stack_fffffffffffffef8;
  ParamDict *in_stack_ffffffffffffff00;
  Mat *local_e8;
  Mat *local_b8;
  undefined1 local_a8 [16];
  Mat local_98;
  undefined1 auStack_50 [40];
  Layer *local_28;
  undefined8 local_20;
  long local_18;
  size_t local_10;
  undefined8 local_8;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_28 = create_layer(in_stack_fffffffffffffeec);
  ParamDict::ParamDict(in_stack_ffffffffffffff00);
  ParamDict::set((ParamDict *)(auStack_50 + 0x18),0,*(int *)(local_18 + 0x2c));
  (*local_28->_vptr_Layer[2])(local_28,auStack_50 + 0x18);
  local_b8 = &local_98;
  do {
    Mat::Mat(local_b8);
    local_b8 = local_b8 + 1;
  } while (local_b8 != (Mat *)auStack_50);
  Mat::operator=((Mat *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                 in_stack_fffffffffffffee0);
  pLVar1 = local_28;
  ModelBinFromMatArray::ModelBinFromMatArray
            ((ModelBinFromMatArray *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  (*pLVar1->_vptr_Layer[3])(pLVar1,local_a8);
  ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)in_stack_fffffffffffffee0);
  (*local_28->_vptr_Layer[4])(local_28,local_20);
  (*local_28->_vptr_Layer[7])(local_28,local_8,local_10,local_20);
  (*local_28->_vptr_Layer[5])(local_28,local_20);
  if (local_28 != (Layer *)0x0) {
    (*local_28->_vptr_Layer[1])();
  }
  local_e8 = (Mat *)auStack_50;
  do {
    local_e8 = local_e8 + -1;
    Mat::~Mat((Mat *)0x14db6e);
  } while (local_e8 != &local_98);
  ParamDict::~ParamDict((ParamDict *)in_stack_fffffffffffffee0);
  return;
}

Assistant:

void quantize_to_int8(const Mat& src, Mat& dst, const Mat& scale_data, const Option& opt)
{
    Layer* quantize = create_layer(LayerType::Quantize);

    ParamDict pd;
    pd.set(0, scale_data.w);

    quantize->load_param(pd);

    Mat weights[1];
    weights[0] = scale_data;

    quantize->load_model(ModelBinFromMatArray(weights));

    quantize->create_pipeline(opt);

    quantize->forward(src, dst, opt);

    quantize->destroy_pipeline(opt);

    delete quantize;
}